

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

bool __thiscall QMYSQLResult::fetchNext(QMYSQLResult *this)

{
  int iVar1;
  QMYSQLResultPrivate *pQVar2;
  long lVar3;
  MYSQL_ROW ppcVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  int nRC;
  QMYSQLResultPrivate *d;
  bool local_29;
  MYSQL_STMT *in_stack_ffffffffffffffd8;
  ErrorType in_stack_ffffffffffffffe4;
  QString *in_stack_ffffffffffffffe8;
  QSqlError local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMYSQLResult *)0x10adea);
  lVar3 = QSqlResult::driver();
  if (lVar3 == 0) {
    local_29 = false;
  }
  else {
    if ((pQVar2->preparedQuery & 1U) == 0) {
      ppcVar4 = (MYSQL_ROW)mysql_fetch_row(pQVar2->result);
      pQVar2->row = ppcVar4;
      if (pQVar2->row == (MYSQL_ROW)0x0) {
        local_29 = false;
        goto LAB_0010af0b;
      }
    }
    else {
      iVar1 = mysql_stmt_fetch(pQVar2->stmt);
      if (iVar1 != 0) {
        if ((iVar1 == 1) || (iVar1 == 0x65)) {
          QCoreApplication::translate
                    (&stack0xffffffffffffffd8,"QMYSQLResult","Unable to fetch data",0);
          qMakeStmtError(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                         in_stack_ffffffffffffffd8);
          (**(code **)(*in_RDI + 0x28))(in_RDI,local_10);
          QSqlError::~QSqlError(local_10);
          QString::~QString((QString *)0x10aeab);
        }
        local_29 = false;
        goto LAB_0010af0b;
      }
    }
    iVar1 = QSqlResult::at();
    (**(code **)(*in_RDI + 0x18))(in_RDI,iVar1 + 1);
    local_29 = true;
  }
LAB_0010af0b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QMYSQLResult::fetchNext()
{
    Q_D(QMYSQLResult);
    if (!driver())
        return false;
    if (d->preparedQuery) {
        int nRC = mysql_stmt_fetch(d->stmt);
        if (nRC) {
            if (nRC == 1 || nRC == MYSQL_DATA_TRUNCATED)
                setLastError(qMakeStmtError(QCoreApplication::translate("QMYSQLResult",
                                    "Unable to fetch data"), QSqlError::StatementError, d->stmt));
            return false;
        }
    } else {
        d->row = mysql_fetch_row(d->result);
        if (!d->row)
            return false;
    }
    setAt(at() + 1);
    return true;
}